

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiContextTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::anon_unknown_0::MultiContextTest::iterate(MultiContextTest *this)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  GLenum err;
  Library *egl;
  EGLDisplay pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar7;
  void *pvVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long lVar10;
  MultiContextTest *pMVar11;
  ulong uVar12;
  char *pcVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  bool bVar17;
  vector<void_*,_std::allocator<void_*>_> contexts;
  UniqueDisplay display;
  EGLContext context;
  EGLint attribList [3];
  UniqueSurface surface;
  EGLint pbufferAttribList [5];
  ResultCollector resultCollector;
  Random rng;
  Functions gl;
  vector<void_*,_std::allocator<void_*>_> local_1cf8;
  MultiContextTest *local_1ce0;
  UniqueDisplay local_1cd8;
  void *local_1cc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1cc0;
  EGLConfig local_1cb8;
  string local_1cb0;
  undefined8 local_1c90;
  undefined4 local_1c88;
  code *local_1c80;
  int local_1c78;
  UniqueSurface local_1c70;
  undefined4 local_1c58;
  undefined4 uStack_1c54;
  undefined4 uStack_1c50;
  undefined4 uStack_1c4c;
  undefined4 local_1c48;
  ResultCollector local_1c38;
  undefined1 local_1be8 [120];
  ios_base local_1b70 [264];
  deRandom local_1a68;
  undefined1 local_1a58 [392];
  glClearFunc local_18d0;
  glClearColorFunc local_1898;
  glFinishFunc local_1410;
  glGetErrorFunc local_1258;
  EGLSurface surface_00;
  
  dVar4 = 0x86aa46;
  if (this->m_sharing == SHARING_SHARED) {
    dVar4 = 0x94ecb894;
  }
  local_1c88 = 0x3038;
  local_1c90 = 0x200003098;
  local_1c58 = 0x3057;
  uStack_1c54 = 0x40;
  uStack_1c50 = 0x3056;
  uStack_1c4c = 0x40;
  local_1c48 = 0x3038;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a58._0_8_ = local_1a58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a58,"");
  tcu::ResultCollector::ResultCollector
            (&local_1c38,(TestLog *)&paVar16->_M_allocated_capacity,(string *)local_1a58);
  if ((undefined1 *)local_1a58._0_8_ != local_1a58 + 0x10) {
    operator_delete((void *)local_1a58._0_8_,local_1a58._16_8_ + 1);
  }
  deRandom_init(&local_1a68,dVar4);
  egl = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  pvVar6 = eglu::getAndInitDisplay
                     ((((this->super_TestCase).m_eglTestCtx)->m_nativeDisplay).
                      super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                      .m_data.ptr,(Version *)0x0);
  eglu::UniqueDisplay::UniqueDisplay(&local_1cd8,egl,pvVar6);
  pvVar6 = local_1cd8.m_display;
  local_1a58._0_8_ = (pointer)0x0;
  local_1a58._8_8_ = (pointer)0x0;
  local_1a58._16_8_ = 0;
  eglu::FilterList::operator<<((FilterList *)local_1a58,isES2Renderable);
  local_1cb8 = eglu::chooseSingleConfig(egl,pvVar6,(FilterList *)local_1a58);
  if ((pointer)local_1a58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a58._0_8_,local_1a58._16_8_ - local_1a58._0_8_);
  }
  pvVar6 = local_1cd8.m_display;
  if (this->m_use == USE_NONE) {
    surface_00 = (EGLSurface)0x0;
  }
  else {
    iVar3 = (*egl->_vptr_Library[10])(egl,local_1cd8.m_display,local_1cb8,&local_1c58);
    surface_00 = (EGLSurface)CONCAT44(extraout_var,iVar3);
  }
  eglu::UniqueSurface::UniqueSurface(&local_1c70,egl,pvVar6,surface_00);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"Failed to create pbuffer.",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                   ,0x7f);
  local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (void **)0x0;
  local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (void **)0x0;
  local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (void **)0x0;
  glw::Functions::Functions((Functions *)local_1a58);
  std::vector<void_*,_std::allocator<void_*>_>::reserve(&local_1cf8,0x80);
  poVar1 = (ostringstream *)(local_1be8 + 8);
  local_1be8._0_8_ = paVar16;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Trying to create ",0x11);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  bVar17 = this->m_sharing == SHARING_SHARED;
  pcVar13 = " ";
  if (bVar17) {
    pcVar13 = " shared ";
  }
  lVar10 = 1;
  if (bVar17) {
    lVar10 = 8;
  }
  local_1ce0 = this;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,pcVar13,lVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"contexts.",9);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1b70);
  poVar1 = (ostringstream *)(local_1be8 + 8);
  local_1be8._0_8_ = paVar16;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Requiring that at least ",0x18);
  pMVar11 = local_1ce0;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1," contexts can be created.",0x19);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_1b70);
  if (pMVar11->m_use == USE_CLEAR) {
    EglTestContext::initGLFunctions
              ((pMVar11->super_TestCase).m_eglTestCtx,(Functions *)local_1a58,(ApiType)0x2);
  }
  (**egl->_vptr_Library)(egl,0x30a0);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                   ,0x8c);
  poVar1 = (ostringstream *)(local_1be8 + 8);
  uVar12 = 0;
  local_1cc0 = paVar16;
  do {
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1be8 + 0x10);
    if (uVar12 == 0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = (void *)0x0;
      if (pMVar11->m_sharing == SHARING_SHARED) {
        dVar4 = deRandom_getUint32(&local_1a68);
        pvVar8 = local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[(ulong)dVar4 % (uVar12 & 0xffffffff)];
      }
    }
    iVar3 = (*egl->_vptr_Library[6])(egl,local_1cd8.m_display,local_1cb8,pvVar8,&local_1c90);
    local_1cc8 = (void *)CONCAT44(extraout_var_00,iVar3);
    iVar3 = (*egl->_vptr_Library[0x1f])(egl);
    if (iVar3 == 0x3000 && local_1cc8 != (void *)0x0) {
      if (local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                  ((vector<void*,std::allocator<void*>> *)&local_1cf8,
                   (iterator)
                   local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1cc8);
      }
      else {
        *local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_1cc8;
        local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      bVar17 = true;
      if (pMVar11->m_use - USE_MAKECURRENT < 2) {
        iVar3 = (*egl->_vptr_Library[0x27])
                          (egl,local_1cd8.m_display,local_1c70.m_surface,local_1c70.m_surface,
                           local_1cc8);
        iVar5 = (*egl->_vptr_Library[0x1f])(egl);
        bVar17 = iVar5 == 0x3000 && iVar3 != 0;
        if (iVar5 == 0x3000 && iVar3 != 0) {
          if (local_1ce0->m_use == USE_CLEAR) {
            (*local_1898)(0.25,0.75,0.5,1.0);
            (*local_18d0)(0x4000);
            (*local_1410)();
            err = (*local_1258)();
            glu::checkError(err,"Failed to clear color.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                            ,0xbe);
          }
        }
        else {
          local_1be8._0_8_ = local_1cc0;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Failed to make ",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"th context current: ",0x14);
          local_1cb0._M_dataplus._M_p = (pointer)eglu::getErrorName;
          local_1cb0._M_string_length._0_4_ = iVar5;
          tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1cb0,(ostream *)poVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_1b70);
          local_1be8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1be8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1be8,"Failed to make context current","");
          tcu::ResultCollector::fail(&local_1c38,(string *)local_1be8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1be8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1be8 + 0x10)) {
            operator_delete((void *)local_1be8._0_8_,(ulong)(local_1be8._16_8_ + 1));
          }
        }
      }
    }
    else {
      local_1be8._0_8_ = local_1cc0;
      poVar2 = (ostringstream *)(local_1be8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"Got error after creating ",0x19);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," contexts.",10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_1b70);
      if (iVar3 == 0x3003) {
        poVar2 = (ostringstream *)(local_1be8 + 8);
        if (uVar12 < 0x20) {
          local_1be8._0_8_ = paVar16;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1be8,
                     "Couldn\'t create the minimum number of contexts required.","");
          tcu::ResultCollector::fail(&local_1c38,(string *)local_1be8);
          uVar14 = local_1be8._16_8_;
          _Var15._M_p = (pointer)local_1be8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1be8._0_8_ != paVar16) goto LAB_0020f71d;
        }
        else {
          local_1be8._0_8_ = local_1cc0;
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,"Got EGL_BAD_ALLOC.",0x12);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1be8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base(local_1b70);
        }
      }
      else {
        local_1c80 = eglu::getErrorName;
        local_1c78 = iVar3;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1cb0,&local_1c80);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1cb0,0,(char *)0x0,0x354053);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 == paVar9) {
          local_1be8._16_8_ = paVar9->_M_allocated_capacity;
          local_1be8._24_8_ = puVar7[3];
          local_1be8._0_8_ = paVar16;
        }
        else {
          local_1be8._16_8_ = paVar9->_M_allocated_capacity;
          local_1be8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar7;
        }
        local_1be8._8_8_ = puVar7[1];
        *puVar7 = paVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        tcu::ResultCollector::fail(&local_1c38,(string *)local_1be8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1be8._0_8_ != paVar16) {
          operator_delete((void *)local_1be8._0_8_,(ulong)(local_1be8._16_8_ + 1));
        }
        uVar14 = local_1cb0.field_2._M_allocated_capacity;
        _Var15._M_p = local_1cb0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1cb0._M_dataplus._M_p != &local_1cb0.field_2) {
LAB_0020f71d:
          operator_delete(_Var15._M_p,(ulong)((long)&((qpTestLog *)uVar14)->flags + 1));
        }
      }
      if (local_1cc8 != (void *)0x0) {
        local_1be8._0_8_ = paVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1be8,
                   "eglCreateContext() produced error, but context is not EGL_NO_CONTEXT","");
        tcu::ResultCollector::fail(&local_1c38,(string *)local_1be8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1be8._0_8_ != paVar16) {
          operator_delete((void *)local_1be8._0_8_,(ulong)(local_1be8._16_8_ + 1));
        }
      }
      bVar17 = false;
    }
    if ((!bVar17) || (bVar17 = uVar12 == 0x7f, pMVar11 = local_1ce0, uVar12 = uVar12 + 1, bVar17)) {
      if (local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar12 = 0;
        do {
          (*egl->_vptr_Library[0x13])
                    (egl,local_1cd8.m_display,
                     local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12]);
          dVar4 = (*egl->_vptr_Library[0x1f])(egl);
          eglu::checkError(dVar4,"destroyContext(*display, contexts[contextNdx])",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                           ,0xc6);
          local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] = (void *)0x0;
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)local_1cf8.
                                        super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)local_1cf8.
                                        super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 3));
      }
      pMVar11 = local_1ce0;
      if (local_1ce0->m_use - USE_MAKECURRENT < 2) {
        (*egl->_vptr_Library[0x27])(egl,local_1cd8.m_display,0,0,0);
        dVar4 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar4,
                         "makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMultiContextTests.cpp"
                         ,0xcb);
      }
      tcu::ResultCollector::setTestContextResult
                (&local_1c38,(pMVar11->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      if (local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start != (void **)0x0) {
        operator_delete(local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage -
                        (long)local_1cf8.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                              .super__Vector_impl_data._M_start);
      }
      eglu::UniqueSurface::~UniqueSurface(&local_1c70);
      eglu::UniqueDisplay::~UniqueDisplay(&local_1cd8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c38.m_message._M_dataplus._M_p != &local_1c38.m_message.field_2) {
        operator_delete(local_1c38.m_message._M_dataplus._M_p,
                        local_1c38.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c38.m_prefix._M_dataplus._M_p != &local_1c38.m_prefix.field_2) {
        operator_delete(local_1c38.m_prefix._M_dataplus._M_p,
                        local_1c38.m_prefix.field_2._M_allocated_capacity + 1);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestCase::IterateResult MultiContextTest::iterate (void)
{
	const deUint32					seed			= m_sharing == SHARING_SHARED ? 2498541716u : 8825414;
	const size_t					maxContextCount	= 128;
	const size_t					minContextCount	= 32;
	const eglw::EGLint				attribList[]	=
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};
	const eglw::EGLint				pbufferAttribList[]	=
	{
		EGL_WIDTH,	64,
		EGL_HEIGHT,	64,
		EGL_NONE
	};

	TestLog&						log				= m_testCtx.getLog();
	tcu::ResultCollector			resultCollector	(log);
	de::Random						rng				(seed);

	const eglw::Library&			egl				= m_eglTestCtx.getLibrary();
	const eglu::UniqueDisplay		display			(egl, eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay()));
	const eglw::EGLConfig			config			= getConfig(egl, *display);

	const eglu::UniqueSurface		surface			(egl, *display, m_use != USE_NONE ? egl.createPbufferSurface(*display, config, pbufferAttribList) : EGL_NO_SURFACE);
	EGLU_CHECK_MSG(egl, "Failed to create pbuffer.");

	std::vector<eglw::EGLContext>	contexts;
	glw::Functions					gl;

	contexts.reserve(maxContextCount);

	log << TestLog::Message << "Trying to create " << maxContextCount << (m_sharing == SHARING_SHARED ? " shared " : " ") << "contexts." << TestLog::EndMessage;
	log << TestLog::Message << "Requiring that at least " << minContextCount << " contexts can be created." << TestLog::EndMessage;

	if (m_use == USE_CLEAR)
		m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));

	EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));

	try
	{
		for (size_t contextCount = 0; contextCount < maxContextCount; contextCount++)
		{
			const eglw::EGLContext	sharedContext	= (m_sharing == SHARING_SHARED && contextCount > 0 ? contexts[rng.getUint32() % (deUint32)contextCount] : EGL_NO_CONTEXT);
			const eglw::EGLContext	context			= egl.createContext(*display, config, sharedContext, attribList);
			const eglw::EGLint		error			= egl.getError();

			if (context == EGL_NO_CONTEXT || error != EGL_SUCCESS)
			{
				log << TestLog::Message << "Got error after creating " << contextCount << " contexts." << TestLog::EndMessage;

				if (error == EGL_BAD_ALLOC)
				{
					if (contextCount < minContextCount)
						resultCollector.fail("Couldn't create the minimum number of contexts required.");
					else
						log << TestLog::Message << "Got EGL_BAD_ALLOC." << TestLog::EndMessage;
				}
				else
					resultCollector.fail("eglCreateContext() produced error that is not EGL_BAD_ALLOC: " + eglu::getErrorStr(error).toString());

				if (context != EGL_NO_CONTEXT)
					resultCollector.fail("eglCreateContext() produced error, but context is not EGL_NO_CONTEXT");

				break;
			}
			else
			{
				contexts.push_back(context);

				if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
				{
					const eglw::EGLBoolean	result				= egl.makeCurrent(*display, *surface, *surface, context);
					const eglw::EGLint		makeCurrentError	= egl.getError();

					if (!result || makeCurrentError != EGL_SUCCESS)
					{
						log << TestLog::Message << "Failed to make " << (contextCount + 1) << "th context current: " << eglu::getErrorStr(makeCurrentError) << TestLog::EndMessage;
						resultCollector.fail("Failed to make context current");

						break;
					}
					else if (m_use == USE_CLEAR)
					{
						gl.clearColor(0.25f, 0.75f, 0.50f, 1.00f);
						gl.clear(GL_COLOR_BUFFER_BIT);
						gl.finish();
						GLU_CHECK_GLW_MSG(gl, "Failed to clear color.");
					}
				}
			}
		}

		for (size_t contextNdx = 0; contextNdx < contexts.size(); contextNdx++)
		{
			EGLU_CHECK_CALL(egl, destroyContext(*display, contexts[contextNdx]));
			contexts[contextNdx] = EGL_NO_CONTEXT;
		}

		if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
			EGLU_CHECK_CALL(egl, makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	}
	catch (...)
	{
		for (size_t contextNdx = 0; contextNdx < contexts.size(); contextNdx++)
		{
			if (contexts[contextNdx] != EGL_NO_CONTEXT)
				EGLU_CHECK_CALL(egl, destroyContext(*display, contexts[contextNdx]));
		}

		if (m_use == USE_MAKECURRENT || m_use == USE_CLEAR)
			EGLU_CHECK_CALL(egl, makeCurrent(*display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

		throw;
	}

	resultCollector.setTestContextResult(m_testCtx);
	return STOP;
}